

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

void capnp::_::WireHelpers::zeroObject
               (SegmentBuilder *segment,CapTableBuilder *capTable,WirePointer *ref)

{
  uint uVar1;
  SegmentBuilder *pSVar2;
  WirePointer *ref_00;
  Fault f;
  Fault local_18;
  
  if (segment->readOnly == false) {
    uVar1 = (ref->offsetAndKind).value;
    if ((uVar1 & 3) < 2) {
      zeroObject(segment,capTable,ref,(word *)(ref + (long)((int)uVar1 >> 2) + 1));
      return;
    }
    if ((uVar1 & 3) == 2) {
      pSVar2 = BuilderArena::getSegment
                         ((BuilderArena *)(segment->super_SegmentReader).arena,
                          (SegmentId)(ref->field_1).structRef);
      if (pSVar2->readOnly == false) {
        uVar1 = (ref->offsetAndKind).value;
        ref_00 = (WirePointer *)
                 ((long)&((pSVar2->super_SegmentReader).ptr.ptr)->content +
                 (ulong)(uVar1 & 0xfffffff8));
        if ((uVar1 & 4) == 0) {
          zeroObject(pSVar2,capTable,ref_00);
          ref_00->offsetAndKind = 0;
          ref_00->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
        }
        else {
          pSVar2 = BuilderArena::getSegment
                             ((BuilderArena *)(pSVar2->super_SegmentReader).arena,
                              (SegmentId)(ref_00->field_1).structRef);
          if (pSVar2->readOnly == false) {
            zeroObject(pSVar2,capTable,ref_00 + 1,
                       (word *)((long)&((pSVar2->super_SegmentReader).ptr.ptr)->content +
                               (ulong)((ref_00->offsetAndKind).value & 0xfffffff8)));
          }
          ref_00->offsetAndKind = 0;
          ref_00->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
          ref_00[1].offsetAndKind = 0;
          ref_00[1].field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
        }
      }
    }
    else {
      if (uVar1 == 3) {
        (*(capTable->super_CapTableReader)._vptr_CapTableReader[2])
                  (capTable,(ulong)(ref->field_1).upper32Bits);
        return;
      }
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
                (&local_18,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x286,FAILED,(char *)0x0,"\"Unknown pointer type.\"",
                 (char (*) [22])"Unknown pointer type.");
      kj::_::Debug::Fault::~Fault(&local_18);
    }
  }
  return;
}

Assistant:

static void zeroObject(SegmentBuilder* segment, CapTableBuilder* capTable, WirePointer* ref) {
    // Zero out the pointed-to object.  Use when the pointer is about to be overwritten making the
    // target object no longer reachable.

    // We shouldn't zero out external data linked into the message.
    if (!segment->isWritable()) return;

    switch (ref->kind()) {
      case WirePointer::STRUCT:
      case WirePointer::LIST:
        zeroObject(segment, capTable, ref, ref->target());
        break;
      case WirePointer::FAR: {
        segment = segment->getArena()->getSegment(ref->farRef.segmentId.get());
        if (segment->isWritable()) {  // Don't zero external data.
          WirePointer* pad = reinterpret_cast<WirePointer*>(ref->farTarget(segment));

          if (ref->isDoubleFar()) {
            segment = segment->getArena()->getSegment(pad->farRef.segmentId.get());
            if (segment->isWritable()) {
              zeroObject(segment, capTable, pad + 1, pad->farTarget(segment));
            }
            zeroMemory(pad, G(2) * POINTERS);
          } else {
            zeroObject(segment, capTable, pad);
            zeroMemory(pad);
          }
        }
        break;
      }
      case WirePointer::OTHER:
        if (ref->isCapability()) {
#if CAPNP_LITE
          KJ_FAIL_ASSERT("Capability encountered in builder in lite mode?") { break; }
#else  // CAPNP_LINE
          capTable->dropCap(ref->capRef.index.get());
#endif  // CAPNP_LITE, else
        } else {
          KJ_FAIL_REQUIRE("Unknown pointer type.") { break; }
        }
        break;
    }
  }